

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O3

int __thiscall
qclab::qgates::CPhase<std::complex<double>_>::toQASM
          (CPhase<std::complex<double>_> *this,ostream *stream,int offset)

{
  int iVar1;
  Phase<std::complex<double>_> *pPVar2;
  int iVar3;
  int in_ECX;
  double angle;
  __string_type local_50;
  
  if ((this->super_QControlledGate2<std::complex<double>_>).controlState_ == 0) {
    qasm1_abi_cxx11_(&local_50,(qclab *)0x468b99,
                     (char *)(ulong)(uint)((this->super_QControlledGate2<std::complex<double>_>).
                                           control_ + offset),in_ECX);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (this->super_QControlledGate2<std::complex<double>_>).control_;
  iVar3 = (*(this->super_QControlledGate2<std::complex<double>_>).
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xf])(this);
  iVar3 = iVar3 + offset;
  pPVar2 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<double>_>,_std::default_delete<qclab::qgates::Phase<std::complex<double>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<double>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<double>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<double>_>_*,_false>._M_head_impl
  ;
  angle = atan2((pPVar2->angle_).sin_,(pPVar2->angle_).cos_);
  qasm2<double>(&local_50,"cp",iVar1 + offset,iVar3,angle);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_QControlledGate2<std::complex<double>_>).controlState_ == 0) {
    qasm1_abi_cxx11_(&local_50,(qclab *)0x468b99,
                     (char *)(ulong)(uint)(offset + (this->
                                                  super_QControlledGate2<std::complex<double>_>).
                                                  control_),iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          stream << qasmCPhase( this->control() + offset ,
                                this->target()  + offset , theta() ) ;
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          return 0 ;
        }